

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_server.cc
# Opt level: O1

void __thiscall
iqxmlrpc::anon_unknown_0::Https_server_connection::log_unknown_exception
          (Https_server_connection *this)

{
  Server *this_00;
  string local_38;
  
  this_00 = (this->super_Server_connection).server;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"iqxmlrpc::Https_server_connection: unknown exception.","");
  Server::log_err_msg(this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Https_server_connection::log_unknown_exception()
{
  server->log_err_msg( "iqxmlrpc::Https_server_connection: unknown exception." );
}